

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

void __thiscall notch::io::LayerSpec::LayerSpec(LayerSpec *this,ABackpropLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined4 extraout_var_02;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  string tag;
  undefined1 local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  valarray<float> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->inputDim = 0;
  this->outputDim = 0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->activation).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**layer->_vptr_ABackpropLayer)(&local_48);
  std::__cxx11::string::_M_assign((string *)this);
  iVar4 = (*layer->_vptr_ABackpropLayer[1])(layer);
  this->inputDim = CONCAT44(extraout_var,iVar4);
  iVar4 = (*layer->_vptr_ABackpropLayer[2])(layer);
  this->outputDim = CONCAT44(extraout_var_00,iVar4);
  (*layer->_vptr_ABackpropLayer[6])(&local_78,layer);
  if (local_78._M_dataplus._M_p == (pointer)0x0) {
    bVar7 = false;
  }
  else {
    (*layer->_vptr_ABackpropLayer[7])(&local_58,layer);
    bVar7 = local_58 != (valarray<float> *)0x0;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_48);
  if (bVar7) {
    iVar4 = (*layer->_vptr_ABackpropLayer[10])(layer);
    (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar4))
              (&local_78,(undefined8 *)CONCAT44(extraout_var_01,iVar4));
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012bcb8;
    p_Var6 = p_Var5 + 2;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)p_Var6;
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar1) {
      p_Var6->_vptr__Sp_counted_base =
           (_func_int **)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
      p_Var5[2]._M_use_count = local_78.field_2._8_4_;
      p_Var5[2]._M_weak_count = local_78.field_2._12_4_;
    }
    else {
      (((element_type *)(p_Var5 + 1))->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
      p_Var6->_vptr__Sp_counted_base =
           (_func_int **)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    }
    p_Var5[1]._M_use_count = (undefined4)local_78._M_string_length;
    p_Var5[1]._M_weak_count = local_78._M_string_length._4_4_;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    (this->activation).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var5 + 1);
    p_Var6 = (this->activation).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->activation).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    (*layer->_vptr_ABackpropLayer[6])(&local_58,layer);
    local_78._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,std::valarray<float>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
               (valarray<float> **)&local_78,(allocator<std::valarray<float>_> *)&local_79,local_58)
    ;
    sVar3 = local_78._M_string_length;
    _Var2._M_p = local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    p_Var5 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var2._M_p;
    (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    (*layer->_vptr_ABackpropLayer[7])(&local_58,layer);
    local_78._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,std::valarray<float>const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
               (valarray<float> **)&local_78,(allocator<std::valarray<float>_> *)&local_79,local_58)
    ;
    sVar3 = local_78._M_string_length;
    _Var2._M_p = local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    p_Var5 = (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var2._M_p;
    (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
  }
  else {
    if (iVar4 != 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_78,"unsupported layer type: ",&local_48);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar4 = (*layer->_vptr_ABackpropLayer[10])(layer);
    (*(code *)**(undefined8 **)CONCAT44(extraout_var_02,iVar4))
              (&local_78,(undefined8 *)CONCAT44(extraout_var_02,iVar4));
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012bcb8;
    p_Var6 = p_Var5 + 2;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)p_Var6;
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar1) {
      p_Var6->_vptr__Sp_counted_base =
           (_func_int **)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
      p_Var5[2]._M_use_count = local_78.field_2._8_4_;
      p_Var5[2]._M_weak_count = local_78.field_2._12_4_;
    }
    else {
      (((element_type *)(p_Var5 + 1))->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
      p_Var6->_vptr__Sp_counted_base =
           (_func_int **)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    }
    p_Var5[1]._M_use_count = (undefined4)local_78._M_string_length;
    p_Var5[1]._M_weak_count = local_78._M_string_length._4_4_;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    (this->activation).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var5 + 1);
    p_Var6 = (this->activation).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->activation).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

LayerSpec(const ABackpropLayer &layer) {
        std::string tag = layer.tag();
        this->tag = tag;
        this->inputDim = layer.inputDim();
        this->outputDim = layer.outputDim();
        // TODO: implement LayerSpec for layers with only weights or bias
        bool hasParameters = layer.getWeights() && layer.getBias();
        bool hasActivation = tag == "ActivationLayer";
        if (hasParameters) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
            weights = std::make_shared<Array>(*layer.getWeights());
            bias = std::make_shared<Array>(*layer.getBias());
        } else if (hasActivation) {
            auto &af = layer.getActivation();
            activation = std::make_shared<std::string>(af.tag());
        } else {
            throw std::invalid_argument("unsupported layer type: " + tag);
        }
    }